

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H16_merge_sort.c
# Opt level: O3

int main(void)

{
  int i;
  long lVar1;
  int arrA [10];
  uint local_78 [12];
  int local_48 [12];
  
  local_48[8] = 0;
  local_48[9] = 6;
  local_48[4] = 8;
  local_48[5] = 1;
  local_48[6] = 2;
  local_48[7] = 9;
  local_48[0] = 5;
  local_48[1] = 7;
  local_48[2] = 3;
  local_48[3] = 4;
  sort(local_48,0,9,(int *)local_78);
  lVar1 = 0;
  do {
    printf("%d ",(ulong)local_78[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  return 0;
}

Assistant:

int main() {
  const int n = 10;
  int arrA[n] = {5, 7, 3, 4, 8, 1, 2, 9, 0, 6};
  int arrB[n];
  sort(arrA, 0, n - 1, arrB);

  for (int i = 0; i < n; i++) {
    printf("%d ", arrB[i]);
  }
}